

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTable::isValid(QAccessibleTable *this)

{
  long lVar1;
  QWidget *widget;
  QWidgetPrivate *pQVar2;
  QAccessibleObject *pQVar3;
  bool bVar4;
  
  pQVar3 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar3);
  lVar1 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  if (lVar1 == 0) {
    bVar4 = false;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x18))(pQVar3);
    widget = (QWidget *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    pQVar2 = qt_widget_private(widget);
    bVar4 = ((pQVar2->data).field_0x12 & 4) == 0;
  }
  return bVar4;
}

Assistant:

bool QAccessibleTable::isValid() const
{
    return view() && !qt_widget_private(view())->data.in_destructor;
}